

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

void DivisionHelper<long_long,_unsigned_long,_3>::
     DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
               (longlong *t,uint64_t *u,longlong *result)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  longlong lVar4;
  longlong *in_RDX;
  ulong *in_RSI;
  long *in_RDI;
  
  if (*in_RSI != 0) {
    if (*in_RDI == 0) {
      *in_RDX = 0;
    }
    else {
      uVar1 = *in_RSI;
      uVar3 = std::numeric_limits<long_long>::max();
      if (uVar3 < uVar1) {
        lVar2 = *in_RDI;
        lVar4 = std::numeric_limits<long_long>::min();
        if ((lVar2 == lVar4) &&
           (uVar1 = *in_RSI, uVar3 = std::numeric_limits<long_long>::min(), uVar1 == uVar3)) {
          *in_RDX = -1;
        }
        else {
          *in_RDX = 0;
        }
      }
      else {
        lVar4 = div_signed_uint64<long_long,_unsigned_long,_false>::divide(*in_RDI,*in_RSI);
        *in_RDX = lVar4;
      }
    }
    return;
  }
  safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnDivZero();
}

Assistant:

SAFEINT_CONSTEXPR14 static void DivideThrow( const T& t, const std::uint64_t& u, T& result ) SAFEINT_CPP_THROW
    {
        static_assert(safeint_internal::int_traits<U>::isUint64, "U must be Uint64");

        if( u == 0 )
        {
            E::SafeIntOnDivZero();
        }

        if( t == 0 )
        {
            result = 0;
            return;
        }

        if( u <= (std::uint64_t)std::numeric_limits<T>::max() )
        {
            result = div_signed_uint64 < T, U, sizeof(T) < sizeof(std::int64_t) > ::divide(t, u);
        }
        else // Corner case
        if( t == std::numeric_limits<T>::min() && u == (std::uint64_t)std::numeric_limits<T>::min() )
        {
            // Min int divided by it's own magnitude is -1
            result = -1;
        }
        else
        {
            result = 0;
        }
    }